

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sectors.cxx
# Opt level: O3

void __thiscall xray_re::xr_scene_sectors::load(xr_scene_sectors *this,xr_reader *r)

{
  uint16_t version;
  short local_1a;
  
  local_1a = 0;
  xr_reader::r_raw_chunk(r,0x1001,&local_1a,2);
  if (local_1a == 0) {
    xr_scene_objects::load(&this->super_xr_scene_objects,r);
    xr_reader::r_raw_chunk(r,0x1002,&this->m_flags,4);
    return;
  }
  __assert_fail("version == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sectors.cxx"
                ,0x61,"virtual void xray_re::xr_scene_sectors::load(xr_reader &)");
}

Assistant:

void xr_scene_sectors::load(xr_reader& r)
{
	uint16_t version = 0;
	r.r_chunk<uint16_t>(TOOLS_CHUNK_VERSION, version);
	xr_assert(version == 0);
	xr_scene_objects::load(r);
	r.r_chunk<uint32_t>(SECTORS_CHUNK_COMMON_FLAGS, m_flags);
}